

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O0

void canvas_undo_redo(_glist *x)

{
  t_undo_type tVar1;
  _undo_action *p_Var2;
  char *undo_action_00;
  int oldstate;
  int iVar3;
  _undo *p_Var4;
  bool bVar5;
  char *local_48;
  int local_34;
  int sequence_depth;
  char *redo_action;
  char *undo_action;
  _undo *udo;
  int dspwas;
  _glist *x_local;
  
  p_Var4 = canvas_undo_get(x);
  if (p_Var4 != (_undo *)0x0) {
    oldstate = canvas_suspend_dsp();
    if ((p_Var4->u_queue != (_undo_action *)0x0) && (p_Var4->u_last->next != (_undo_action *)0x0)) {
      p_Var4->u_doing = 1;
      p_Var4->u_last = p_Var4->u_last->next;
      canvas_editmode(x,1.0);
      glist_noselect(x);
      canvas_undo_set_name(p_Var4->u_last->name);
      if (p_Var4->u_last->type == UNDO_SEQUENCE_START) {
        local_34 = 1;
        do {
          bVar5 = false;
          if (p_Var4->u_last->next != (_undo_action *)0x0) {
            p_Var2 = p_Var4->u_last->next;
            p_Var4->u_last = p_Var2;
            bVar5 = p_Var2 != (_undo_action *)0x0;
          }
          if (!bVar5) break;
          tVar1 = p_Var4->u_last->type;
          if (tVar1 == UNDO_SEQUENCE_START) {
            local_34 = local_34 + 1;
          }
          else if (tVar1 == UNDO_SEQUENCE_END) {
            local_34 = local_34 + -1;
          }
          else {
            canvas_undo_doit(x,p_Var4->u_last,2,"canvas_undo_redo");
          }
        } while (0 < local_34);
        if (local_34 < 0) {
          bug("undo sequence end without start");
        }
        else if (0 < local_34) {
          bug("undo sequence start without end");
        }
      }
      canvas_undo_doit(x,p_Var4->u_last,2,"canvas_undo_redo");
      undo_action_00 = p_Var4->u_last->name;
      if (p_Var4->u_last->next == (_undo_action *)0x0) {
        local_48 = "no";
      }
      else {
        local_48 = p_Var4->u_last->next->name;
      }
      p_Var4->u_doing = 0;
      canvas_show_undomenu(x,undo_action_00,local_48);
      iVar3 = canvas_undo_isdirty(x);
      canvas_dirty(x,(float)iVar3);
    }
    canvas_resume_dsp(oldstate);
  }
  return;
}

Assistant:

void canvas_undo_redo(t_canvas *x)
{
    int dspwas;
    t_undo *udo = canvas_undo_get(x);
    if (!udo) return;
    dspwas = canvas_suspend_dsp();
    if (udo->u_queue && udo->u_last->next)
    {
        char *undo_action, *redo_action;
        udo->u_doing = 1;
        udo->u_last = udo->u_last->next;
        canvas_editmode(x, 1);
        glist_noselect(x);
        canvas_undo_set_name(udo->u_last->name);

        if(UNDO_SEQUENCE_START == udo->u_last->type)
        {
            int sequence_depth = 1;
            while(udo->u_last->next && (udo->u_last = udo->u_last->next))
            {
                DEBUG_UNDO(post("%s:sequence[%d] %d", __FUNCTION__, sequence_depth, udo->u_last->type));
                switch(udo->u_last->type)
                {
                case UNDO_SEQUENCE_END:
                    sequence_depth--;
                    break;
                case UNDO_SEQUENCE_START:
                    sequence_depth++;
                    break;
                default:
                    canvas_undo_doit(x, udo->u_last, UNDO_REDO, __FUNCTION__);
                }
                if (sequence_depth < 1)
                    break;
            }
            if (sequence_depth < 0)
                bug("undo sequence end without start");
            else if (sequence_depth > 0)
                bug("undo sequence start without end");
        }

        canvas_undo_doit(x, udo->u_last, UNDO_REDO, __FUNCTION__);
        undo_action = udo->u_last->name;
        redo_action = (udo->u_last->next ? udo->u_last->next->name : "no");
        udo->u_doing = 0;
        /* here we call updating of all unpaired hubs and nodes since their
           regular call will fail in case their position needed to be updated
           by undo/redo first to reflect the old one */
        canvas_show_undomenu(x, undo_action, redo_action);
        canvas_dirty(x, canvas_undo_isdirty(x));
    }
    canvas_resume_dsp(dspwas);
}